

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ReadMemoryResponse>::construct
          (BasicTypeInfo<dap::ReadMemoryResponse> *this,void *ptr)

{
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(undefined8 *)ptr = 0;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  ReadMemoryResponse::ReadMemoryResponse((ReadMemoryResponse *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }